

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.h
# Opt level: O0

void __thiscall idx2::mmap_err_code_s::mmap_err_code_s(mmap_err_code_s *this,mmap_err_code Value)

{
  mmap_err_code local_44;
  name_map *local_38;
  enum_item *It;
  mmap_err_code Value_local;
  mmap_err_code_s *this_local;
  
  for (local_38 = &NameMap;
      (local_38 != (name_map *)0x2c0be8 && (local_38->Arr[0].ItemVal != Value));
      local_38 = (name_map *)(local_38->Arr + 1)) {
  }
  if (local_38 == (name_map *)0x2c0be8) {
    local_44 = __Invalid__;
  }
  else {
    local_44 = local_38->Arr[0].ItemVal;
  }
  this->Val = local_44;
  return;
}

Assistant:

idx2_Enum(mmap_err_code,
          int,
          idx2_CommonErrs,
          MappingFailed,
          MapViewFailed,
          AllocateFailed,
          FlushFailed,
          SyncFailed,
          UnmapFailed);


namespace idx2
{


enum class map_mode
{
  Read,
  Write
};

#if defined(_WIN32)
using file_handle = HANDLE;
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
using file_handle = int;
#endif

struct mmap_file
{
  file_handle File;
  file_handle FileMapping;
  map_mode Mode;
  buffer Buf;
};

error<mmap_err_code>
OpenFile(mmap_file* MMap, cstr Name, map_mode Mode);

error<mmap_err_code>
MapFile(mmap_file* MMap, i64 Bytes = 0);

error<mmap_err_code>
FlushFile(mmap_file* MMap, byte* Start = nullptr, i64 Bytes = 0);

error<mmap_err_code>
SyncFile(mmap_file* MMap);

error<mmap_err_code>
UnmapFile(mmap_file* MMap);

error<mmap_err_code>
CloseFile(mmap_file* MMap);

template <typename t> void
Write(mmap_file* MMap, const t* Data);

template <typename t> void
Write(mmap_file* MMap, const t* Data, i64 Size);

template <typename t> void
Write(mmap_file* MMap, t Val);


}